

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void selectInnerLoop(Parse *pParse,Select *p,int srcTab,SortCtx *pSort,DistinctCtx *pDistinct,
                    SelectDest *pDest,int iContinue,int iBreak)

{
  ushort uVar1;
  uint uVar2;
  Vdbe *p_00;
  char *zP4;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Op *pOVar10;
  CollSeq *zP4_00;
  int iVar11;
  ExprList *pEVar12;
  int *piVar13;
  int op;
  ExprList *pEVar14;
  u8 uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  bool bVar22;
  RowLoadInfo sRowLoadInfo;
  RowLoadInfo local_38;
  
  if (pDistinct == (DistinctCtx *)0x0) {
    uVar15 = '\0';
  }
  else {
    uVar15 = pDistinct->eTnctType;
  }
  if (pSort == (SortCtx *)0x0) {
    pSort = (SortCtx *)0x0;
  }
  else if (pSort->pOrderBy == (ExprList *)0x0) {
    pSort = (SortCtx *)0x0;
  }
  p_00 = pParse->pVdbe;
  bVar4 = pDest->eDest;
  iVar9 = pDest->iSDParm;
  if ((uVar15 == '\0' && pSort == (SortCtx *)0x0) && (0 < p->iOffset)) {
    sqlite3VdbeAddOp3(p_00,0x2f,p->iOffset,iContinue,1);
  }
  uVar20 = (uint)bVar4;
  pEVar14 = p->pEList;
  uVar2 = pEVar14->nExpr;
  uVar16 = (ulong)uVar2;
  iVar7 = pDest->iSdst;
  if (iVar7 == 0) {
    if (pSort == (SortCtx *)0x0) {
      iVar5 = pParse->nMem;
      iVar11 = 0;
    }
    else {
      iVar11 = (~*(uint *)&pSort->sortFlags & 1) + pSort->pOrderBy->nExpr;
      iVar5 = pParse->nMem + iVar11;
    }
    iVar7 = iVar5 + 1;
    pDest->iSdst = iVar7;
LAB_0017bbb3:
    pParse->nMem = iVar5 + uVar2;
  }
  else {
    iVar5 = pParse->nMem;
    iVar11 = 0;
    if (iVar5 < (int)(iVar7 + uVar2)) goto LAB_0017bbb3;
  }
  pDest->nSdst = uVar2;
  iVar5 = iVar7;
  if (srcTab < 0) {
    bVar3 = 1;
    if ((1 < uVar20 - 9) && (uVar20 != 0xd)) {
      if (uVar20 == 3) goto LAB_0017bd44;
      bVar3 = 0;
    }
    if ((uVar15 == '\0' && pSort != (SortCtx *)0x0) && (bVar4 & 0xfd) != 0xc) {
      lVar18 = (long)pSort->nOBSat;
      pEVar12 = pSort->pOrderBy;
      iVar21 = pEVar12->nExpr;
      uVar19 = uVar16;
      if (pSort->nOBSat < iVar21) {
        do {
          uVar1 = pEVar12->a[lVar18].u.x.iOrderByCol;
          lVar18 = lVar18 + 1;
          if (uVar1 != 0) {
            p->pEList->a[uVar1 - 1].u.x.iOrderByCol = (short)lVar18 - (short)pSort->nOBSat;
            pEVar12 = pSort->pOrderBy;
            iVar21 = pEVar12->nExpr;
          }
        } while (lVar18 < iVar21);
        pEVar14 = p->pEList;
        uVar19 = (ulong)(uint)pEVar14->nExpr;
      }
      bVar3 = bVar3 | 0xc;
      if (0 < (int)uVar19) {
        lVar18 = 0;
        do {
          bVar22 = *(short *)((long)&pEVar14->a[0].u + lVar18) != 0;
          if (bVar22) {
            iVar5 = 0;
          }
          uVar16 = (ulong)((int)uVar16 - (uint)bVar22);
          lVar18 = lVar18 + 0x20;
        } while (uVar19 << 5 != lVar18);
      }
    }
    local_38.regResult = iVar7;
    local_38.ecelFlags = bVar3;
    if (((p->iLimit == 0) || ((bVar3 & 8) == 0)) || (iVar11 < 1)) {
      sqlite3ExprCodeExprList(pParse,pEVar14,iVar7,0,bVar3);
    }
    else {
      pSort->pDeferredRowLoad = &local_38;
      iVar5 = 0;
    }
  }
  else if (0 < (int)uVar2) {
    uVar20 = 0;
    do {
      sqlite3VdbeAddOp3(p_00,0x5a,srcTab,uVar20,iVar7 + uVar20);
      uVar20 = uVar20 + 1;
    } while (uVar2 != uVar20);
  }
LAB_0017bd44:
  iVar21 = (int)uVar16;
  if (uVar15 != '\0') {
    if (pDistinct->eTnctType == '\x01') {
      sqlite3VdbeChangeToNoop(p_00,pDistinct->addrTnct);
    }
    else if (pDistinct->eTnctType == '\x02') {
      iVar17 = pParse->nMem;
      pParse->nMem = iVar21 + iVar17;
      sqlite3VdbeChangeToNoop(p_00,pDistinct->addrTnct);
      iVar6 = pDistinct->addrTnct;
      if (iVar6 < 0) {
        iVar6 = p_00->nOp + -1;
      }
      iVar17 = iVar17 + 1;
      if (p_00->db->mallocFailed == '\0') {
        pOVar10 = p_00->aOp + iVar6;
      }
      else {
        pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar10->opcode = 'I';
      pOVar10->p1 = 1;
      pOVar10->p2 = iVar17;
      if (0 < iVar21) {
        iVar6 = p_00->nOp;
        lVar18 = 8;
        uVar19 = 0;
        do {
          zP4_00 = sqlite3ExprCollSeq(pParse,*(Expr **)((long)p->pEList->a + lVar18 + -8));
          if (uVar19 < iVar21 - 1U) {
            op = 0x34;
            iVar8 = iVar6 + iVar21;
          }
          else {
            op = 0x35;
            iVar8 = iContinue;
          }
          sqlite3VdbeAddOp3(p_00,op,iVar7 + (int)uVar19,iVar8,iVar17 + (int)uVar19);
          sqlite3VdbeChangeP4(p_00,-1,(char *)zP4_00,-2);
          if (0 < (long)p_00->nOp) {
            p_00->aOp[(long)p_00->nOp + -1].p5 = 0x80;
          }
          uVar19 = uVar19 + 1;
          lVar18 = lVar18 + 0x20;
        } while (uVar16 != uVar19);
      }
      sqlite3VdbeAddOp3(p_00,0x4e,iVar7,iVar17,iVar21 - 1U);
    }
    else {
      codeDistinct(pParse,pDistinct->tabTnct,iContinue,iVar21,iVar7);
    }
    if ((pSort == (SortCtx *)0x0) && (0 < p->iOffset)) {
      sqlite3VdbeAddOp3(p_00,0x2f,p->iOffset,iContinue,1);
    }
  }
  switch(bVar4) {
  case 1:
    if (pParse->nTempReg == '\0') {
      iVar5 = pParse->nMem + 1;
      pParse->nMem = iVar5;
    }
    else {
      bVar4 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar4;
      iVar5 = pParse->aTempReg[bVar4];
    }
    sqlite3VdbeAddOp3(p_00,0x5c,iVar7,iVar21,iVar5);
    iVar9 = sqlite3VdbeAddOp3(p_00,0x84,iVar9,iVar5,iVar7);
    if (p_00->db->mallocFailed == '\0') {
      pOVar10 = p_00->aOp;
      pOVar10[iVar9].p4type = -3;
      pOVar10[iVar9].p4.i = iVar21;
    }
    if (iVar5 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar5;
      }
    }
    break;
  case 2:
    iVar5 = 0x85;
    goto LAB_0017c22a;
  case 3:
    iVar5 = 0x46;
    iVar21 = 0;
    iVar7 = iVar9;
    iVar9 = 1;
LAB_0017c22a:
    sqlite3VdbeAddOp3(p_00,iVar5,iVar9,iVar7,iVar21);
    break;
  case 5:
  case 6:
  case 0xc:
  case 0xe:
    iVar17 = sqlite3GetTempRange(pParse,iVar11 + 1);
    sqlite3VdbeAddOp3(p_00,0x5c,iVar7,iVar21,iVar17 + iVar11);
    if (bVar4 == 6) {
      iVar6 = sqlite3VdbeAddOp3(p_00,0x1d,iVar9 + 1,p_00->nOp + 4,iVar17);
      if (p_00->db->mallocFailed == '\0') {
        pOVar10 = p_00->aOp;
        pOVar10[iVar6].p4type = -3;
        pOVar10[iVar6].p4.i = 0;
      }
      iVar7 = sqlite3VdbeAddOp3(p_00,0x84,iVar9 + 1,iVar17,iVar7);
      if (p_00->db->mallocFailed == '\0') {
        pOVar10 = p_00->aOp;
        pOVar10[iVar7].p4type = -3;
        pOVar10[iVar7].p4.i = iVar21;
      }
    }
    if (pSort == (SortCtx *)0x0) {
      if (pParse->nTempReg == '\0') {
        iVar7 = pParse->nMem + 1;
        pParse->nMem = iVar7;
      }
      else {
        bVar4 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar4;
        iVar7 = pParse->aTempReg[bVar4];
      }
      sqlite3VdbeAddOp3(p_00,0x79,iVar9,iVar7,0);
      sqlite3VdbeAddOp3(p_00,0x7a,iVar9,iVar17,iVar7);
      if (0 < (long)p_00->nOp) {
        p_00->aOp[(long)p_00->nOp + -1].p5 = 8;
      }
      if (iVar7 != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse->nTempReg = bVar4 + 1;
          pParse->aTempReg[bVar4] = iVar7;
        }
      }
    }
    else {
      pushOntoSorter(pParse,pSort,p,iVar17 + iVar11,iVar5,1,iVar11);
    }
    if (iVar11 == 0) {
      if (iVar17 != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse->nTempReg = bVar4 + 1;
          piVar13 = pParse->aTempReg + bVar4;
          goto LAB_0017c178;
        }
      }
    }
    else if (pParse->nRangeReg <= iVar11) {
      pParse->nRangeReg = iVar11 + 1;
      piVar13 = &pParse->iRangeReg;
LAB_0017c178:
      *piVar13 = iVar17;
    }
    break;
  case 7:
  case 8:
    pEVar14 = pDest->pOrderBy;
    uVar2 = pEVar14->nExpr;
    if (pParse->nTempReg == '\0') {
      iVar5 = pParse->nMem + 1;
      pParse->nMem = iVar5;
    }
    else {
      bVar3 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar3;
      iVar5 = pParse->aTempReg[bVar3];
    }
    iVar17 = uVar2 + 2;
    iVar11 = sqlite3GetTempRange(pParse,iVar17);
    iVar6 = iVar11 + uVar2 + 1;
    if (bVar4 == 8) {
      iVar8 = sqlite3VdbeAddOp3(p_00,0x1d,iVar9 + 1,0,iVar7);
      if (p_00->db->mallocFailed == '\0') {
        pOVar10 = p_00->aOp;
        pOVar10[iVar8].p4type = -3;
        pOVar10[iVar8].p4.i = iVar21;
      }
      sqlite3VdbeAddOp3(p_00,0x5c,iVar7,iVar21,iVar6);
      sqlite3VdbeAddOp3(p_00,0x84,iVar9 + 1,iVar6,0);
      if (0 < (long)p_00->nOp) {
        p_00->aOp[(long)p_00->nOp + -1].p5 = 0x10;
      }
    }
    else {
      sqlite3VdbeAddOp3(p_00,0x5c,iVar7,iVar21,iVar6);
      iVar8 = 0;
    }
    if (0 < (int)uVar2) {
      lVar18 = 0;
      iVar21 = iVar11;
      do {
        sqlite3VdbeAddOp3(p_00,0x4f,(uint)*(ushort *)((long)&pEVar14->a[0].u + lVar18) + iVar7 + -1,
                          iVar21,0);
        iVar21 = iVar21 + 1;
        lVar18 = lVar18 + 0x20;
      } while ((ulong)uVar2 << 5 != lVar18);
    }
    sqlite3VdbeAddOp3(p_00,0x78,iVar9,iVar11 + uVar2,0);
    sqlite3VdbeAddOp3(p_00,0x5c,iVar11,iVar17,iVar5);
    iVar9 = sqlite3VdbeAddOp3(p_00,0x84,iVar9,iVar5,iVar11);
    if (p_00->db->mallocFailed == '\0') {
      pOVar10 = p_00->aOp;
      pOVar10[iVar9].p4type = -3;
      pOVar10[iVar9].p4.i = iVar17;
    }
    if (iVar8 != 0) {
      if (p_00->db->mallocFailed == '\0') {
        iVar9 = p_00->nOp + -1;
        if (-1 < iVar8) {
          iVar9 = iVar8;
        }
        pOVar10 = p_00->aOp + iVar9;
      }
      else {
        pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar10->p2 = p_00->nOp;
    }
    if (iVar5 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar5;
      }
    }
    if (iVar17 == 1) {
      if (iVar11 != 0) {
        bVar4 = pParse->nTempReg;
        if ((ulong)bVar4 < 8) {
          pParse->nTempReg = bVar4 + 1;
          piVar13 = pParse->aTempReg + bVar4;
          goto LAB_0017c54e;
        }
      }
    }
    else if (pParse->nRangeReg < iVar17) {
      pParse->nRangeReg = iVar17;
      piVar13 = &pParse->iRangeReg;
LAB_0017c54e:
      *piVar13 = iVar11;
    }
    break;
  case 9:
  case 0xd:
    if (pSort != (SortCtx *)0x0) {
LAB_0017c1ba:
      pushOntoSorter(pParse,pSort,p,iVar7,iVar5,iVar21,iVar11);
      return;
    }
    if (bVar4 == 0xd) {
      iVar7 = pDest->iSDParm;
      iVar9 = 0xe;
      iVar21 = 0;
    }
    else {
      iVar9 = 0x51;
    }
    sqlite3VdbeAddOp3(p_00,iVar9,iVar7,iVar21,0);
    goto LAB_0017c5d3;
  case 10:
    if (pSort != (SortCtx *)0x0) goto LAB_0017c1ba;
    goto LAB_0017c5d3;
  case 0xb:
    if (pSort != (SortCtx *)0x0) goto LAB_0017c1ba;
    if (pParse->nTempReg == '\0') {
      iVar5 = pParse->nMem + 1;
      pParse->nMem = iVar5;
    }
    else {
      bVar4 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar4;
      iVar5 = pParse->aTempReg[bVar4];
    }
    zP4 = pDest->zAffSdst;
    iVar11 = sqlite3VdbeAddOp3(p_00,0x5c,iVar7,iVar21,iVar5);
    sqlite3VdbeChangeP4(p_00,iVar11,zP4,iVar21);
    iVar9 = sqlite3VdbeAddOp3(p_00,0x84,iVar9,iVar5,iVar7);
    if (p_00->db->mallocFailed == '\0') {
      pOVar10 = p_00->aOp;
      pOVar10[iVar9].p4type = -3;
      pOVar10[iVar9].p4.i = iVar21;
    }
    if (iVar5 != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = iVar5;
      }
    }
    goto LAB_0017c5d3;
  }
  if (pSort == (SortCtx *)0x0) {
LAB_0017c5d3:
    if (p->iLimit != 0) {
      sqlite3VdbeAddOp3(p_00,0x31,p->iLimit,iBreak,0);
    }
  }
  return;
}

Assistant:

static void selectInnerLoop(
  Parse *pParse,          /* The parser context */
  Select *p,              /* The complete select statement being coded */
  int srcTab,             /* Pull data from this table if non-negative */
  SortCtx *pSort,         /* If not NULL, info on how to process ORDER BY */
  DistinctCtx *pDistinct, /* If not NULL, info on how to process DISTINCT */
  SelectDest *pDest,      /* How to dispose of the results */
  int iContinue,          /* Jump here to continue with next row */
  int iBreak              /* Jump here to break out of the inner loop */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int hasDistinct;            /* True if the DISTINCT keyword is present */
  int eDest = pDest->eDest;   /* How to dispose of results */
  int iParm = pDest->iSDParm; /* First argument to disposal method */
  int nResultCol;             /* Number of result columns */
  int nPrefixReg = 0;         /* Number of extra registers before regResult */
  RowLoadInfo sRowLoadInfo;   /* Info for deferred row loading */

  /* Usually, regResult is the first cell in an array of memory cells
  ** containing the current result row. In this case regOrig is set to the
  ** same value. However, if the results are being sent to the sorter, the
  ** values for any expressions that are also part of the sort-key are omitted
  ** from this array. In this case regOrig is set to zero.  */
  int regResult;              /* Start of memory holding current results */
  int regOrig;                /* Start of memory holding full result (or 0) */

  assert( v );
  assert( p->pEList!=0 );
  hasDistinct = pDistinct ? pDistinct->eTnctType : WHERE_DISTINCT_NOOP;
  if( pSort && pSort->pOrderBy==0 ) pSort = 0;
  if( pSort==0 && !hasDistinct ){
    assert( iContinue!=0 );
    codeOffset(v, p->iOffset, iContinue);
  }

  /* Pull the requested columns.
  */
  nResultCol = p->pEList->nExpr;

  if( pDest->iSdst==0 ){
    if( pSort ){
      nPrefixReg = pSort->pOrderBy->nExpr;
      if( !(pSort->sortFlags & SORTFLAG_UseSorter) ) nPrefixReg++;
      pParse->nMem += nPrefixReg;
    }
    pDest->iSdst = pParse->nMem+1;
    pParse->nMem += nResultCol;
  }else if( pDest->iSdst+nResultCol > pParse->nMem ){
    /* This is an error condition that can result, for example, when a SELECT
    ** on the right-hand side of an INSERT contains more result columns than
    ** there are columns in the table on the left.  The error will be caught
    ** and reported later.  But we need to make sure enough memory is allocated
    ** to avoid other spurious errors in the meantime. */
    pParse->nMem += nResultCol;
  }
  pDest->nSdst = nResultCol;
  regOrig = regResult = pDest->iSdst;
  if( srcTab>=0 ){
    for(i=0; i<nResultCol; i++){
      sqlite3VdbeAddOp3(v, OP_Column, srcTab, i, regResult+i);
      VdbeComment((v, "%s", p->pEList->a[i].zName));
    }
  }else if( eDest!=SRT_Exists ){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    ExprList *pExtra = 0;
#endif
    /* If the destination is an EXISTS(...) expression, the actual
    ** values returned by the SELECT are not required.
    */
    u8 ecelFlags;    /* "ecel" is an abbreviation of "ExprCodeExprList" */
    ExprList *pEList;
    if( eDest==SRT_Mem || eDest==SRT_Output || eDest==SRT_Coroutine ){
      ecelFlags = SQLITE_ECEL_DUP;
    }else{
      ecelFlags = 0;
    }
    if( pSort && hasDistinct==0 && eDest!=SRT_EphemTab && eDest!=SRT_Table ){
      /* For each expression in p->pEList that is a copy of an expression in
      ** the ORDER BY clause (pSort->pOrderBy), set the associated 
      ** iOrderByCol value to one more than the index of the ORDER BY 
      ** expression within the sort-key that pushOntoSorter() will generate.
      ** This allows the p->pEList field to be omitted from the sorted record,
      ** saving space and CPU cycles.  */
      ecelFlags |= (SQLITE_ECEL_OMITREF|SQLITE_ECEL_REF);

      for(i=pSort->nOBSat; i<pSort->pOrderBy->nExpr; i++){
        int j;
        if( (j = pSort->pOrderBy->a[i].u.x.iOrderByCol)>0 ){
          p->pEList->a[j-1].u.x.iOrderByCol = i+1-pSort->nOBSat;
        }
      }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
      selectExprDefer(pParse, pSort, p->pEList, &pExtra);
      if( pExtra && pParse->db->mallocFailed==0 ){
        /* If there are any extra PK columns to add to the sorter records,
        ** allocate extra memory cells and adjust the OpenEphemeral 
        ** instruction to account for the larger records. This is only
        ** required if there are one or more WITHOUT ROWID tables with
        ** composite primary keys in the SortCtx.aDefer[] array.  */
        VdbeOp *pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
        pOp->p2 += (pExtra->nExpr - pSort->nDefer);
        pOp->p4.pKeyInfo->nAllField += (pExtra->nExpr - pSort->nDefer);
        pParse->nMem += pExtra->nExpr;
      }
#endif

      /* Adjust nResultCol to account for columns that are omitted
      ** from the sorter by the optimizations in this branch */
      pEList = p->pEList;
      for(i=0; i<pEList->nExpr; i++){
        if( pEList->a[i].u.x.iOrderByCol>0
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
         || pEList->a[i].bSorterRef
#endif
        ){
          nResultCol--;
          regOrig = 0;
        }
      }

      testcase( regOrig );
      testcase( eDest==SRT_Set );
      testcase( eDest==SRT_Mem );
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      assert( eDest==SRT_Set || eDest==SRT_Mem 
           || eDest==SRT_Coroutine || eDest==SRT_Output );
    }
    sRowLoadInfo.regResult = regResult;
    sRowLoadInfo.ecelFlags = ecelFlags;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    sRowLoadInfo.pExtra = pExtra;
    sRowLoadInfo.regExtraResult = regResult + nResultCol;
    if( pExtra ) nResultCol += pExtra->nExpr;
#endif
    if( p->iLimit
     && (ecelFlags & SQLITE_ECEL_OMITREF)!=0 
     && nPrefixReg>0
    ){
      assert( pSort!=0 );
      assert( hasDistinct==0 );
      pSort->pDeferredRowLoad = &sRowLoadInfo;
      regOrig = 0;
    }else{
      innerLoopLoadRow(pParse, p, &sRowLoadInfo);
    }
  }

  /* If the DISTINCT keyword was present on the SELECT statement
  ** and this row has been seen before, then do not make this row
  ** part of the result.
  */
  if( hasDistinct ){
    switch( pDistinct->eTnctType ){
      case WHERE_DISTINCT_ORDERED: {
        VdbeOp *pOp;            /* No longer required OpenEphemeral instr. */
        int iJump;              /* Jump destination */
        int regPrev;            /* Previous row content */

        /* Allocate space for the previous row */
        regPrev = pParse->nMem+1;
        pParse->nMem += nResultCol;

        /* Change the OP_OpenEphemeral coded earlier to an OP_Null
        ** sets the MEM_Cleared bit on the first register of the
        ** previous value.  This will cause the OP_Ne below to always
        ** fail on the first iteration of the loop even if the first
        ** row is all NULLs.
        */
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        pOp = sqlite3VdbeGetOp(v, pDistinct->addrTnct);
        pOp->opcode = OP_Null;
        pOp->p1 = 1;
        pOp->p2 = regPrev;

        iJump = sqlite3VdbeCurrentAddr(v) + nResultCol;
        for(i=0; i<nResultCol; i++){
          CollSeq *pColl = sqlite3ExprCollSeq(pParse, p->pEList->a[i].pExpr);
          if( i<nResultCol-1 ){
            sqlite3VdbeAddOp3(v, OP_Ne, regResult+i, iJump, regPrev+i);
            VdbeCoverage(v);
          }else{
            sqlite3VdbeAddOp3(v, OP_Eq, regResult+i, iContinue, regPrev+i);
            VdbeCoverage(v);
           }
          sqlite3VdbeChangeP4(v, -1, (const char *)pColl, P4_COLLSEQ);
          sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
        }
        assert( sqlite3VdbeCurrentAddr(v)==iJump || pParse->db->mallocFailed );
        sqlite3VdbeAddOp3(v, OP_Copy, regResult, regPrev, nResultCol-1);
        break;
      }

      case WHERE_DISTINCT_UNIQUE: {
        sqlite3VdbeChangeToNoop(v, pDistinct->addrTnct);
        break;
      }

      default: {
        assert( pDistinct->eTnctType==WHERE_DISTINCT_UNORDERED );
        codeDistinct(pParse, pDistinct->tabTnct, iContinue, nResultCol,
                     regResult);
        break;
      }
    }
    if( pSort==0 ){
      codeOffset(v, p->iOffset, iContinue);
    }
  }

  switch( eDest ){
    /* In this mode, write each query result to the key of the temporary
    ** table iParm.
    */
#ifndef SQLITE_OMIT_COMPOUND_SELECT
    case SRT_Union: {
      int r1;
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* Construct a record from the query result, but instead of
    ** saving that record, use it as a key to delete elements from
    ** the temporary table iParm.
    */
    case SRT_Except: {
      sqlite3VdbeAddOp3(v, OP_IdxDelete, iParm, regResult, nResultCol);
      break;
    }
#endif /* SQLITE_OMIT_COMPOUND_SELECT */

    /* Store the result as data using a unique key.
    */
    case SRT_Fifo:
    case SRT_DistFifo:
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempRange(pParse, nPrefixReg+1);
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      testcase( eDest==SRT_Fifo );
      testcase( eDest==SRT_DistFifo );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1+nPrefixReg);
#ifndef SQLITE_OMIT_CTE
      if( eDest==SRT_DistFifo ){
        /* If the destination is DistFifo, then cursor (iParm+1) is open
        ** on an ephemeral index. If the current row is already present
        ** in the index, do not write it to the output. If not, add the
        ** current row to the index and proceed with writing it to the
        ** output table as well.  */
        int addr = sqlite3VdbeCurrentAddr(v) + 4;
        sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, addr, r1, 0);
        VdbeCoverage(v);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm+1, r1,regResult,nResultCol);
        assert( pSort==0 );
      }
#endif
      if( pSort ){
        assert( regResult==regOrig );
        pushOntoSorter(pParse, pSort, p, r1+nPrefixReg, regOrig, 1, nPrefixReg);
      }else{
        int r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, r2);
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, r2);
        sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      sqlite3ReleaseTempRange(pParse, r1, nPrefixReg+1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      if( pSort ){
        /* At first glance you would think we could optimize out the
        ** ORDER BY in this case since the order of entries in the set
        ** does not matter.  But there might be a LIMIT clause, in which
        ** case the order does matter */
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        int r1 = sqlite3GetTempReg(pParse);
        assert( sqlite3Strlen30(pDest->zAffSdst)==nResultCol );
        sqlite3VdbeAddOp4(v, OP_MakeRecord, regResult, nResultCol, 
            r1, pDest->zAffSdst, nResultCol);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
        sqlite3ReleaseTempReg(pParse, r1);
      }
      break;
    }

    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, iParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell or array of 
    ** memory cells and break out of the scan loop.
    */
    case SRT_Mem: {
      if( pSort ){
        assert( nResultCol<=pDest->nSdst );
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        assert( nResultCol==pDest->nSdst );
        assert( regResult==iParm );
        /* The LIMIT clause will jump out of the loop for us */
      }
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    case SRT_Coroutine:       /* Send data to a co-routine */
    case SRT_Output: {        /* Return the results */
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      if( pSort ){
        pushOntoSorter(pParse, pSort, p, regResult, regOrig, nResultCol,
                       nPrefixReg);
      }else if( eDest==SRT_Coroutine ){
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }else{
        sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, nResultCol);
      }
      break;
    }

#ifndef SQLITE_OMIT_CTE
    /* Write the results into a priority queue that is order according to
    ** pDest->pOrderBy (in pSO).  pDest->iSDParm (in iParm) is the cursor for an
    ** index with pSO->nExpr+2 columns.  Build a key using pSO for the first
    ** pSO->nExpr columns, then make sure all keys are unique by adding a
    ** final OP_Sequence column.  The last column is the record as a blob.
    */
    case SRT_DistQueue:
    case SRT_Queue: {
      int nKey;
      int r1, r2, r3;
      int addrTest = 0;
      ExprList *pSO;
      pSO = pDest->pOrderBy;
      assert( pSO );
      nKey = pSO->nExpr;
      r1 = sqlite3GetTempReg(pParse);
      r2 = sqlite3GetTempRange(pParse, nKey+2);
      r3 = r2+nKey+1;
      if( eDest==SRT_DistQueue ){
        /* If the destination is DistQueue, then cursor (iParm+1) is open
        ** on a second ephemeral index that holds all values every previously
        ** added to the queue. */
        addrTest = sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, 0, 
                                        regResult, nResultCol);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r3);
      if( eDest==SRT_DistQueue ){
        sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm+1, r3);
        sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      }
      for(i=0; i<nKey; i++){
        sqlite3VdbeAddOp2(v, OP_SCopy,
                          regResult + pSO->a[i].u.x.iOrderByCol - 1,
                          r2+i);
      }
      sqlite3VdbeAddOp2(v, OP_Sequence, iParm, r2+nKey);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, r2, nKey+2, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, r2, nKey+2);
      if( addrTest ) sqlite3VdbeJumpHere(v, addrTest);
      sqlite3ReleaseTempReg(pParse, r1);
      sqlite3ReleaseTempRange(pParse, r2, nKey+2);
      break;
    }
#endif /* SQLITE_OMIT_CTE */



#if !defined(SQLITE_OMIT_TRIGGER)
    /* Discard the results.  This is used for SELECT statements inside
    ** the body of a TRIGGER.  The purpose of such selects is to call
    ** user-defined functions that have side effects.  We do not care
    ** about the actual results of the select.
    */
    default: {
      assert( eDest==SRT_Discard );
      break;
    }
#endif
  }

  /* Jump to the end of the loop if the LIMIT is reached.  Except, if
  ** there is a sorter, in which case the sorter has already limited
  ** the output for us.
  */
  if( pSort==0 && p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }
}